

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NearestNeighbors.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::NearestNeighborsIndex::clear_IndexType(NearestNeighborsIndex *this)

{
  LinearIndex *this_00;
  SingleKdTreeIndex *this_01;
  IndexTypeCase IVar1;
  Arena *pAVar2;
  NearestNeighborsIndex *this_local;
  
  IVar1 = IndexType_case(this);
  if (IVar1 != INDEXTYPE_NOT_SET) {
    if (IVar1 == kLinearIndex) {
      pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
      if ((pAVar2 == (Arena *)0x0) &&
         (this_00 = (this->IndexType_).linearindex_, this_00 != (LinearIndex *)0x0)) {
        LinearIndex::~LinearIndex(this_00);
        operator_delete(this_00,0x18);
      }
    }
    else if (((IVar1 == kSingleKdTreeIndex) &&
             (pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation
                                 (&this->super_MessageLite), pAVar2 == (Arena *)0x0)) &&
            (this_01 = (this->IndexType_).singlekdtreeindex_, this_01 != (SingleKdTreeIndex *)0x0))
    {
      SingleKdTreeIndex::~SingleKdTreeIndex(this_01);
      operator_delete(this_01,0x18);
    }
  }
  this->_oneof_case_[0] = 0;
  return;
}

Assistant:

void NearestNeighborsIndex::clear_IndexType() {
// @@protoc_insertion_point(one_of_clear_start:CoreML.Specification.NearestNeighborsIndex)
  switch (IndexType_case()) {
    case kLinearIndex: {
      if (GetArenaForAllocation() == nullptr) {
        delete IndexType_.linearindex_;
      }
      break;
    }
    case kSingleKdTreeIndex: {
      if (GetArenaForAllocation() == nullptr) {
        delete IndexType_.singlekdtreeindex_;
      }
      break;
    }
    case INDEXTYPE_NOT_SET: {
      break;
    }
  }
  _oneof_case_[0] = INDEXTYPE_NOT_SET;
}